

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lecturedemorefine.cc
# Opt level: O3

void lecturedemo::regrefMeshSequence(shared_ptr<lf::mesh::Mesh> *mesh_p,int refsteps)

{
  long *plVar1;
  undefined8 this;
  ulong uVar2;
  ostream *poVar3;
  pointer psVar4;
  shared_ptr<lf::refinement::MeshHierarchy> multi_mesh_p;
  undefined1 local_58 [24];
  MeshHierarchy *local_40;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_38;
  
  lf::refinement::GenerateMeshHierarchyByUniformRefinemnt
            ((refinement *)&local_40,mesh_p,refsteps,rp_regular);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t Sequence of nested meshes created\n",0x24);
  lf::refinement::MeshHierarchy::PrintInfo(local_40,(ostream *)&std::cout,0);
  uVar2 = (ulong)((long)(local_40->meshes_).
                        super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_40->meshes_).
                       super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  if ((int)uVar2 != 0) {
    local_58._16_8_ = uVar2 & 0xffffffff;
    psVar4 = (pointer)0x0;
    do {
      lf::refinement::MeshHierarchy::getMesh((MeshHierarchy *)local_58,(size_type)local_40);
      this = local_58._8_8_;
      plVar1 = (long *)CONCAT71(local_58._1_7_,local_58[0]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"==== Mesh on level ",0x13);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      (**(code **)(*plVar1 + 0x20))(plVar1,1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," NODEs, ",8);
      (**(code **)(*plVar1 + 0x20))(plVar1,2);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," EDGEs, ",8);
      (**(code **)(*plVar1 + 0x20))(plVar1,3);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," TRIAs, ",8);
      (**(code **)(*plVar1 + 0x20))(plVar1,4);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," QUADs.",7);
      local_58[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_58,1);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
      }
      psVar4 = (pointer)((long)&(psVar4->
                                super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr + 1);
    } while ((pointer)local_58._16_8_ != psVar4);
  }
  if (local_38._M_t.
      super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t
      .super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
      super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_38._M_t.
               super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
               ._M_t.
               super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
               .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void regrefMeshSequence(const std::shared_ptr<lf::mesh::Mesh>& mesh_p,
                        int refsteps) {
  const std::shared_ptr<lf::refinement::MeshHierarchy> multi_mesh_p =
      lf::refinement::GenerateMeshHierarchyByUniformRefinemnt(mesh_p, refsteps);
  lf::refinement::MeshHierarchy& multi_mesh{*multi_mesh_p};

  // Ouput summary information about hierarchy of nested meshes
  std::cout << "\t Sequence of nested meshes created\n";
  multi_mesh.PrintInfo(std::cout);
  // Number of levels
  const size_type L = multi_mesh.NumLevels();

  // Retrieve meshes on all levels
  for (size_type level = 0; level < L; ++level) {
    const std::shared_ptr<const lf::mesh::Mesh> lev_mesh_p =
        multi_mesh.getMesh(level);
    // Reference to current mesh
    const lf::mesh::Mesh& mesh{*lev_mesh_p};
    // Output of mesh information
    std::cout << "==== Mesh on level " << level << ": "
              << mesh.NumEntities(lf::base::RefEl::kPoint()) << " NODEs, "
              << mesh.NumEntities(lf::base::RefEl::kSegment()) << " EDGEs, "
              << mesh.NumEntities(lf::base::RefEl::kTria()) << " TRIAs, "
              << mesh.NumEntities(lf::base::RefEl::kQuad()) << " QUADs."
              << '\n';
  }
}